

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void mazexy(level *lev,coord *cc)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  uVar4 = 0xffffffff;
  do {
    iVar8 = x_maze_max >> 1;
    uVar1 = mt_random();
    cc->x = SUB161(ZEXT416(uVar1) % SEXT816((long)(iVar8 + -1)),0) * '\x02' + '\x03';
    iVar8 = y_maze_max >> 1;
    uVar1 = mt_random();
    cVar3 = SUB161(ZEXT416(uVar1) % SEXT816((long)(iVar8 + -1)),0) * '\x02' + '\x03';
    cc->y = cVar3;
    if (uVar4 == 0x62) {
      uVar4 = 99;
      break;
    }
    uVar4 = uVar4 + 1;
  } while (lev->locations[cc->x][cVar3].typ != '\x19');
  if (uVar4 < 99) {
    return;
  }
  iVar8 = x_maze_max >> 1;
  if (1 < iVar8) {
    iVar2 = y_maze_max >> 1;
    iVar5 = 0;
    do {
      if (1 < iVar2) {
        cVar3 = (char)iVar5 * '\x02' + '\x03';
        cc->x = cVar3;
        cVar6 = '\x03';
        iVar7 = iVar2 + -1;
        do {
          if (lev->locations[cVar3][cVar6].typ == '\x19') {
            cc->y = cVar6;
            return;
          }
          cVar6 = cVar6 + '\x02';
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        cc->y = (char)iVar2 * '\x02' + -1;
      }
      bVar9 = iVar5 != iVar8 + -2;
      iVar5 = iVar5 + 1;
    } while (bVar9);
  }
  panic("mazexy: can\'t find a place!");
}

Assistant:

void mazexy(struct level *lev, coord *cc)
{
	int cpt=0;

	do {
	    cc->x = 3 + 2*rn2((x_maze_max>>1) - 1);
	    cc->y = 3 + 2*rn2((y_maze_max>>1) - 1);
	    cpt++;
	} while (cpt < 100 && lev->locations[cc->x][cc->y].typ != ROOM);
	if (cpt >= 100) {
		int x, y;
		/* last try */
		for (x = 0; x < (x_maze_max>>1) - 1; x++)
		    for (y = 0; y < (y_maze_max>>1) - 1; y++) {
			cc->x = 3 + 2 * x;
			cc->y = 3 + 2 * y;
			if (lev->locations[cc->x][cc->y].typ == ROOM)
			    return;
		    }
		panic("mazexy: can't find a place!");
	}
	return;
}